

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ErrorMsg(Parse *pParse,char *zFormat,...)

{
  long lVar1;
  char in_AL;
  char *pcVar2;
  long *in_RDI;
  __va_list_tag *in_XMM3_Qb;
  char *in_XMM4_Qa;
  sqlite3 *in_XMM4_Qb;
  sqlite3 *db;
  va_list ap;
  char *zMsg;
  void *in_stack_ffffffffffffff08;
  sqlite3 *in_stack_ffffffffffffff10;
  __va_list_tag *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  sqlite3 *in_stack_ffffffffffffff80;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff70 = in_XMM3_Qb;
    in_stack_ffffffffffffff78 = in_XMM4_Qa;
    in_stack_ffffffffffffff80 = in_XMM4_Qb;
  }
  lVar1 = *in_RDI;
  pcVar2 = sqlite3VMPrintf(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70);
  if (*(char *)(lVar1 + 0x65) == '\0') {
    *(int *)(in_RDI + 6) = (int)in_RDI[6] + 1;
    sqlite3DbFree(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    in_RDI[1] = (long)pcVar2;
    *(undefined4 *)(in_RDI + 3) = 1;
  }
  else {
    sqlite3DbFree(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ErrorMsg(Parse *pParse, const char *zFormat, ...){
  char *zMsg;
  va_list ap;
  sqlite3 *db = pParse->db;
  va_start(ap, zFormat);
  zMsg = sqlite3VMPrintf(db, zFormat, ap);
  va_end(ap);
  if( db->suppressErr ){
    sqlite3DbFree(db, zMsg);
  }else{
    pParse->nErr++;
    sqlite3DbFree(db, pParse->zErrMsg);
    pParse->zErrMsg = zMsg;
    pParse->rc = SQLITE_ERROR;
  }
}